

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Serializer.cpp
# Opt level: O2

void __thiscall
adios2::format::BP5Serializer::AddSimpleField
          (BP5Serializer *this,FMFieldList *FieldP,int *CountP,char *Name,char *Type,int ElementSize
          )

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  FMFieldList p_Var4;
  int iVar5;
  long lVar6;
  
  iVar2 = *CountP;
  lVar6 = (long)iVar2;
  p_Var4 = *FieldP;
  if (lVar6 == 0) {
    iVar5 = 0;
    if (p_Var4 == (FMFieldList)0x0) {
      p_Var4 = (FMFieldList)malloc(0x30);
      iVar5 = 0;
      iVar2 = 0;
      goto LAB_005e003a;
    }
  }
  else {
    iVar5 = p_Var4[lVar6 + -1].field_size;
    pcVar3 = strchr(p_Var4[lVar6 + -1].field_type,0x5b);
    iVar1 = 8;
    if (pcVar3 == (char *)0x0) {
      iVar1 = iVar5;
    }
    iVar5 = iVar1 + p_Var4[lVar6 + -1].field_offset + ElementSize + -1;
    iVar5 = iVar5 - iVar5 % ElementSize;
  }
  p_Var4 = (FMFieldList)realloc(p_Var4,(long)(iVar2 + 2) * 0x18);
  iVar2 = *CountP;
LAB_005e003a:
  *FieldP = p_Var4;
  *CountP = iVar2 + 1;
  pcVar3 = strdup(Name);
  p_Var4[iVar2].field_name = pcVar3;
  pcVar3 = strdup(Type);
  p_Var4[iVar2].field_type = pcVar3;
  p_Var4[iVar2].field_size = ElementSize;
  p_Var4[iVar2].field_offset = iVar5;
  p_Var4[(long)iVar2 + 1].field_name = (char *)0x0;
  p_Var4[(long)iVar2 + 1].field_type = (char *)0x0;
  p_Var4[(long)iVar2 + 1].field_size = 0;
  p_Var4[(long)iVar2 + 1].field_offset = 0;
  return;
}

Assistant:

void BP5Serializer::AddSimpleField(FMFieldList *FieldP, int *CountP, const char *Name,
                                   const char *Type, int ElementSize)
{
    int Offset = 0;
    FMFieldList Field;
    if (*CountP)
    {
        FMFieldList PriorField;
        PriorField = &((*FieldP)[(*CountP) - 1]);
        int PriorFieldSize = PriorField->field_size;
        if (strchr(PriorField->field_type, '['))
        {
            // really a pointer
            PriorFieldSize = sizeof(void *);
        }
        Offset = ((PriorField->field_offset + PriorFieldSize + ElementSize - 1) / ElementSize) *
                 ElementSize;
    }
    if (*FieldP)
        *FieldP = (FMFieldList)realloc(*FieldP, (*CountP + 2) * sizeof((*FieldP)[0]));
    else
        *FieldP = (FMFieldList)malloc((*CountP + 2) * sizeof((*FieldP)[0]));

    Field = &((*FieldP)[*CountP]);
    (*CountP)++;
    Field->field_name = strdup(Name);
    Field->field_type = strdup(Type);
    Field->field_size = ElementSize;
    Field->field_offset = Offset;
    Field++;
    Field->field_name = NULL;
    Field->field_type = NULL;
    Field->field_size = 0;
    Field->field_offset = 0;
}